

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

RepeatedEventControlSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RepeatedEventControlSyntax,slang::syntax::RepeatedEventControlSyntax_const&>
          (BumpAllocator *this,RepeatedEventControlSyntax *args)

{
  undefined4 uVar1;
  RepeatedEventControlSyntax *pRVar2;
  long lVar3;
  RepeatedEventControlSyntax *pRVar4;
  byte bVar5;
  
  bVar5 = 0;
  pRVar2 = (RepeatedEventControlSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((RepeatedEventControlSyntax *)this->endPtr < pRVar2 + 1) {
    pRVar2 = (RepeatedEventControlSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pRVar2 + 1);
  }
  pRVar4 = pRVar2;
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_TimingControlSyntax).super_SyntaxNode.field_0x4;
    (pRVar4->super_TimingControlSyntax).super_SyntaxNode.kind =
         (args->super_TimingControlSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pRVar4->super_TimingControlSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (RepeatedEventControlSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pRVar4 = (RepeatedEventControlSyntax *)((long)pRVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pRVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }